

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O3

void __thiscall
leveldb::InternalFilterPolicy::CreateFilter
          (InternalFilterPolicy *this,Slice *keys,int n,string *dst)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < n) {
    lVar3 = 0;
    do {
      uVar2 = *(ulong *)((long)&keys->size_ + lVar3);
      if (uVar2 < 8) {
        __assert_fail("internal_key.size() >= 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/dbformat.h"
                      ,0x60,"Slice leveldb::ExtractUserKey(const Slice &)");
      }
      *(ulong *)((long)&keys->size_ + lVar3) = uVar2 - 8;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (*this->user_policy_->_vptr_FilterPolicy[3])();
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InternalFilterPolicy::CreateFilter(const Slice* keys, int n,
                                        std::string* dst) const {
  // We rely on the fact that the code in table.cc does not mind us
  // adjusting keys[].
  Slice* mkey = const_cast<Slice*>(keys);
  for (int i = 0; i < n; i++) {
    mkey[i] = ExtractUserKey(keys[i]);
    // TODO(sanjay): Suppress dups?
  }
  user_policy_->CreateFilter(keys, n, dst);
}